

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O1

bool __thiscall
sliding_puzzle::SlidingPuzzle::generateSolvableStartState(SlidingPuzzle *this,int soln_lower_bound)

{
  SlidingPuzzleState *__args;
  pointer pvVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  long lVar7;
  long lVar8;
  SlidingPuzzle *pSVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  bool bVar14;
  SlidingPuzzleStatePtr rand_state;
  SlidingPuzzleStatePtr new_state;
  int local_64;
  undefined4 local_60;
  undefined1 local_59;
  SlidingPuzzleStatePtr local_58;
  SlidingPuzzleState *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  SlidingPuzzle *local_38;
  
  __args = (this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  pvVar1 = (__args->state_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(__args->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar8 != 0) {
    lVar8 = (lVar8 >> 3) * -0x5555555555555555;
    lVar10 = 0;
    do {
      lVar2 = *(long *)&pvVar1[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      lVar11 = (long)*(pointer *)
                      ((long)&pvVar1[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl +
                      8) - lVar2;
      if (lVar11 != 0) {
        lVar11 = lVar11 >> 2;
        lVar7 = 0;
        do {
          bVar14 = *(int *)(lVar2 + lVar7 * 4) == puzzle_anchor;
          if (bVar14) {
            local_60 = (int)lVar7;
          }
          if (bVar14) {
            local_64 = (int)lVar10;
          }
          lVar7 = lVar7 + 1;
        } while (lVar11 + (ulong)(lVar11 == 0) != lVar7);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar8 + (ulong)(lVar8 == 0));
  }
  local_58.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzleState,std::allocator<sliding_puzzle::SlidingPuzzleState>,sliding_puzzle::SlidingPuzzleState&>
            (&local_58.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SlidingPuzzleState **)&local_58,
             (allocator<sliding_puzzle::SlidingPuzzleState> *)&local_48,__args);
  local_48 = (SlidingPuzzleState *)0x0;
  pSVar9 = (SlidingPuzzle *)&stack0xffffffffffffffc0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzleState,std::allocator<sliding_puzzle::SlidingPuzzleState>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pSVar9,&local_48,
             (allocator<sliding_puzzle::SlidingPuzzleState> *)&local_59);
  local_38 = this;
  if (0 < soln_lower_bound) {
    iVar13 = 0;
    iVar12 = local_64;
    uVar6 = local_60;
    do {
      iVar3 = rand();
      bVar14 = generateSuccessorForAction
                         (pSVar9,&local_58,&local_64,(&DAT_0010a782)[iVar3 % 4],local_48);
      if (bVar14) {
        pvVar1 = (local_48->state_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = (long)(local_48->state_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
        if (lVar8 != 0) {
          lVar8 = (lVar8 >> 3) * -0x5555555555555555;
          lVar10 = 0;
          do {
            lVar2 = *(long *)&pvVar1[lVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl;
            lVar11 = (long)*(pointer *)
                            ((long)&pvVar1[lVar10].super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl + 8) - lVar2;
            if (lVar11 != 0) {
              lVar11 = lVar11 >> 2;
              lVar7 = 0;
              do {
                bVar14 = *(int *)(lVar2 + lVar7 * 4) == puzzle_anchor;
                if (bVar14) {
                  uVar6 = (int)lVar7;
                }
                if (bVar14) {
                  iVar12 = (int)lVar10;
                }
                lVar7 = lVar7 + 1;
              } while (lVar11 + (ulong)(lVar11 == 0) != lVar7);
            }
            lVar10 = lVar10 + 1;
            local_60 = uVar6;
          } while (lVar10 != lVar8 + (ulong)(lVar8 == 0));
        }
        pSVar9 = (SlidingPuzzle *)
                 local_58.
                 super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_64 = iVar12;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&(local_58.
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->state_,&local_48->state_);
        iVar13 = iVar13 + 1;
      }
    } while (iVar13 < soln_lower_bound);
  }
  pSVar9 = local_38;
  (local_38->start_).
  super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_58.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(local_38->start_).
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &local_58.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The solvable start state is: ",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  poVar4 = operator<<((ostream *)&std::cout,
                      (pSVar9->start_).
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  uVar5 = std::ostream::flush();
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_58.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

bool SlidingPuzzle::generateSolvableStartState(int soln_lower_bound)
{
  int anchor_location[2];

  for (int j=0; j<goal_->state_.size(); ++j)
  {
    for (int k=0; k<goal_->state_[j].size(); ++k)
    {
      if (goal_->state_[j][k] == puzzle_anchor)
      {
        anchor_location[0] = j;
        anchor_location[1] = k;
      }
    }
  }

  SlidingPuzzleStatePtr rand_state = std::make_shared<SlidingPuzzleState>(*goal_);
  SlidingPuzzleStatePtr new_state = std::make_shared<SlidingPuzzleState>();

  for (int i=0; i<soln_lower_bound;)
  {
    char successor_action[] = {'N', 'E', 'W', 'S'};
    int rand_ind = rand() % static_cast<int>(4);


    if (generateSuccessorForAction(rand_state,
                                   anchor_location,
                                   successor_action[rand_ind],
                                   *new_state))
    {
      for (int j=0; j<new_state->state_.size(); ++j)
      {
        for (int k=0; k<new_state->state_[j].size(); ++k)
        {
          if (new_state->state_[j][k] == puzzle_anchor)
          {
            anchor_location[0] = j;
            anchor_location[1] = k;
          }
        }
      }

      *rand_state = *new_state;
      ++i;
    }
  }

  start_ = rand_state;

  std::cout << "The solvable start state is: " << std::endl;
  std::cout << *start_ << std::endl;

}